

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRleCompressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::RleCompressor::uncompress
          (RleCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  char *pcVar1;
  int iVar2;
  InputExc *this_00;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  
  if (inSize == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = rleUncompress(inSize,this->_maxScanLineSize,inPtr,this->_tmpBuffer);
    if (iVar2 == 0) {
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(this_00,"Data decoding (rle) failed.");
      __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    pcVar5 = this->_tmpBuffer;
    if (1 < iVar2) {
      cVar6 = *pcVar5;
      pcVar4 = pcVar5 + 1;
      do {
        cVar6 = cVar6 + *pcVar4 + -0x80;
        *pcVar4 = cVar6;
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 < pcVar5 + iVar2);
      pcVar5 = this->_tmpBuffer;
    }
    if (0 < iVar2) {
      pcVar4 = this->_outBuffer;
      pcVar3 = pcVar4 + iVar2;
      lVar7 = 0;
      do {
        pcVar1 = pcVar4 + lVar7 * 2;
        *pcVar1 = pcVar5[lVar7];
        if (pcVar3 <= pcVar1 + 1) break;
        pcVar1[1] = pcVar5[lVar7 + (ulong)(iVar2 + 1U >> 1)];
        lVar7 = lVar7 + 1;
      } while (pcVar1 + 2 < pcVar3);
    }
  }
  *outPtr = this->_outBuffer;
  return iVar2;
}

Assistant:

int
RleCompressor::uncompress (const char *inPtr,
			   int inSize,
			   int minY,
			   const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Decode the run-length encoded data
    //

    int outSize;

    if (0 == (outSize = rleUncompress (inSize, _maxScanLineSize,
				       (const signed char *) inPtr,
				       _tmpBuffer)))
    {
	throw IEX_NAMESPACE::InputExc ("Data decoding (rle) failed.");
    }

    //
    // Predictor.
    //

    {
	unsigned char *t = (unsigned char *) _tmpBuffer + 1;
	unsigned char *stop = (unsigned char *) _tmpBuffer + outSize;

	while (t < stop)
	{
	    int d = int (t[-1]) + int (t[0]) - 128;
	    t[0] = d;
	    ++t;
	}
    }

    //
    // Reorder the pixel data.
    //

    {
	const char *t1 = _tmpBuffer;
	const char *t2 = _tmpBuffer + (outSize + 1) / 2;
	char *s = _outBuffer;
	char *stop = s + outSize;

	while (true)
	{
	    if (s < stop)
		*(s++) = *(t1++);
	    else
		break;

	    if (s < stop)
		*(s++) = *(t2++);
	    else
		break;
	}
    }

    outPtr = _outBuffer;
    return outSize;
}